

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O2

void FIX::double_conversion::TrimAndCut
               (Vector<const_char> buffer,int exponent,char *buffer_copy_space,int space_size,
               Vector<const_char> *trimmed,int *updated_exponent)

{
  undefined8 *puVar1;
  undefined1 auVar2 [12];
  int to;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  ulong extraout_RDX;
  ulong uVar6;
  undefined4 in_register_00000084;
  int iVar7;
  int i;
  long lVar8;
  Vector<const_char> VVar9;
  Vector<const_char> local_48;
  Vector<const_char> *local_38;
  
  uVar5 = (ulong)(uint)exponent;
  uVar6 = buffer._8_8_;
  local_48.start_ = buffer.start_;
  puVar1 = (undefined8 *)CONCAT44(in_register_00000084,space_size);
  local_48.length_ = buffer.length_;
  local_38 = trimmed;
  for (iVar7 = 0; iVar7 < (int)uVar6; iVar7 = iVar7 + 1) {
    pcVar4 = Vector<const_char>::operator[](&local_48,iVar7);
    if (*pcVar4 != '0') {
      VVar9 = Vector<const_char>::SubVector(&local_48,iVar7,local_48.length_);
      iVar7 = VVar9.length_;
      goto LAB_0017a101;
    }
    uVar6 = (ulong)(uint)local_48.length_;
    uVar5 = extraout_RDX;
  }
  iVar7 = 0;
  VVar9._8_8_ = uVar5;
  VVar9.start_ = local_48.start_;
LAB_0017a101:
  local_48.start_ = VVar9.start_;
  iVar3 = iVar7;
  local_48.length_ = iVar7;
  do {
    to = iVar3;
    if (to < 1) {
      iVar7 = iVar7 + exponent;
      auVar2._8_4_ = 0;
      auVar2._0_8_ = local_48.start_;
      goto LAB_0017a17a;
    }
    pcVar4 = Vector<const_char>::operator[](&local_48,to + -1);
    iVar3 = to + -1;
  } while (*pcVar4 == '0');
  VVar9 = Vector<const_char>::SubVector(&local_48,0,to);
  auVar2 = VVar9._0_12_;
  local_48.start_ = VVar9.start_;
  local_48.length_ = VVar9.length_;
  iVar7 = (iVar7 - local_48.length_) + exponent;
  if (local_48.length_ < 0x30d) {
LAB_0017a17a:
    *puVar1 = auVar2._0_8_;
    *(int *)(puVar1 + 1) = auVar2._8_4_;
    *(int *)&local_38->start_ = iVar7;
  }
  else {
    for (lVar8 = 0; lVar8 != 0x30b; lVar8 = lVar8 + 1) {
      pcVar4 = Vector<const_char>::operator[](&local_48,(int)lVar8);
      buffer_copy_space[lVar8] = *pcVar4;
    }
    pcVar4 = Vector<const_char>::operator[](&local_48,local_48.length_ + -1);
    if (*pcVar4 == '0') {
      __assert_fail("buffer[buffer.length() - 1] != \'0\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/strtod.cc"
                    ,0x78,
                    "void FIX::double_conversion::CutToMaxSignificantDigits(Vector<const char>, int, char *, int *)"
                   );
    }
    buffer_copy_space[0x30b] = '1';
    *(int *)&local_38->start_ = local_48.length_ + iVar7 + -0x30c;
    Vector<const_char>::Vector(&local_48,buffer_copy_space,0x30c);
    *(int *)(puVar1 + 1) = local_48.length_;
    *puVar1 = local_48.start_;
  }
  return;
}

Assistant:

static void TrimAndCut(Vector<const char> buffer, int exponent,
                       char* buffer_copy_space, int space_size,
                       Vector<const char>* trimmed, int* updated_exponent) {
  Vector<const char> left_trimmed = TrimLeadingZeros(buffer);
  Vector<const char> right_trimmed = TrimTrailingZeros(left_trimmed);
  exponent += left_trimmed.length() - right_trimmed.length();
  if (right_trimmed.length() > kMaxSignificantDecimalDigits) {
    (void) space_size;  // Mark variable as used.
    ASSERT(space_size >= kMaxSignificantDecimalDigits);
    CutToMaxSignificantDigits(right_trimmed, exponent,
                              buffer_copy_space, updated_exponent);
    *trimmed = Vector<const char>(buffer_copy_space,
                                 kMaxSignificantDecimalDigits);
  } else {
    *trimmed = right_trimmed;
    *updated_exponent = exponent;
  }
}